

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_setup_quant(TX_SIZE tx_size,int use_optimize_b,int xform_quant_idx,int use_quant_b_adapt,
                    QUANT_PARAM *qparam)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  TX_SIZE in_DIL;
  int *in_R8;
  
  iVar1 = av1_get_tx_scale(in_DIL);
  *in_R8 = iVar1;
  *(TX_SIZE *)(in_R8 + 1) = in_DIL;
  in_R8[6] = in_ECX;
  in_R8[7] = in_ESI;
  in_R8[8] = in_EDX;
  in_R8[2] = 0;
  in_R8[3] = 0;
  in_R8[4] = 0;
  in_R8[5] = 0;
  return;
}

Assistant:

void av1_setup_quant(TX_SIZE tx_size, int use_optimize_b, int xform_quant_idx,
                     int use_quant_b_adapt, QUANT_PARAM *qparam) {
  qparam->log_scale = av1_get_tx_scale(tx_size);
  qparam->tx_size = tx_size;

  qparam->use_quant_b_adapt = use_quant_b_adapt;

  // TODO(bohanli): optimize_b and quantization idx has relationship,
  // but is kind of buried and complicated in different encoding stages.
  // Should have a unified function to derive quant_idx, rather than
  // determine and pass in the quant_idx
  qparam->use_optimize_b = use_optimize_b;
  qparam->xform_quant_idx = xform_quant_idx;

  qparam->qmatrix = NULL;
  qparam->iqmatrix = NULL;
}